

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_arithm<unsigned_int>(uint length,uint value1,uint value2,bool allowTrash)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  int iVar19;
  uint *puVar20;
  undefined1 (*pSrc1) [16];
  undefined1 (*pSrc2) [16];
  element_type *pDst;
  undefined8 *puVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint local_2358;
  uint local_2354;
  uint i_19;
  uint i_18;
  uint i_17;
  uint i_15;
  uint i_13;
  uint i_11;
  uint i_9;
  uint i_8;
  uint i_6;
  uint i_4;
  uint r;
  uint i_2;
  uint *result;
  uint *v2;
  uint *v1;
  shared_ptr<unsigned_int> presult;
  undefined1 local_22f0 [8];
  shared_ptr<unsigned_int> pv2;
  shared_ptr<unsigned_int> pv1;
  bool allowTrash_local;
  uint value2_local;
  uint value1_local;
  uint length_local;
  int local_22ac;
  undefined8 uStack_22a8;
  int i_1;
  undefined8 uStack_22a0;
  uint local_2294;
  undefined1 (*local_2290) [16];
  uint local_2288;
  int local_2284;
  undefined1 (*local_2280) [16];
  undefined1 *local_2278;
  uint local_226c;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined1 (*local_21e0) [16];
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined1 (*local_21c0) [16];
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined1 (*local_21a0) [16];
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined1 (*local_2180) [16];
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined1 (*local_2160) [16];
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined1 (*local_2140) [16];
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined1 (*local_2120) [16];
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined1 (*local_2100) [16];
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined1 (*local_20e0) [16];
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined1 (*local_20c0) [16];
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined1 (*local_20a0) [16];
  undefined8 local_2098;
  undefined8 uStack_2090;
  undefined1 (*local_2080) [16];
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined1 (*local_2060) [16];
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined1 (*local_2040) [16];
  undefined8 local_2038;
  undefined8 uStack_2030;
  uint local_201c;
  uint local_2018;
  uint local_2014;
  uint local_2010;
  uint local_200c;
  undefined1 (*local_2008) [16];
  uint local_2000;
  int local_1ffc;
  undefined8 uStack_1ff8;
  int i;
  undefined8 uStack_1ff0;
  uint local_1fe4;
  undefined1 (*local_1fe0) [16];
  uint local_1fd8;
  int local_1fd4;
  undefined1 (*local_1fd0) [16];
  undefined1 *local_1fc8;
  uint local_1fbc;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined1 (*local_1f30) [16];
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined1 (*local_1f10) [16];
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined1 (*local_1ef0) [16];
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined1 (*local_1ed0) [16];
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined1 (*local_1eb0) [16];
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined1 (*local_1e90) [16];
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined1 (*local_1e70) [16];
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined1 (*local_1e50) [16];
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined1 (*local_1e30) [16];
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined1 (*local_1e10) [16];
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined1 (*local_1df0) [16];
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined1 (*local_1dd0) [16];
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined1 (*local_1db0) [16];
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined1 (*local_1d90) [16];
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  uint local_1d74;
  uint local_1d70;
  uint local_1d6c;
  uint local_1d68;
  uint local_1d64;
  element_type *local_1d60;
  undefined1 (*local_1d58) [16];
  undefined1 (*local_1d50) [16];
  int local_1d48;
  uint local_1d44;
  int i_3;
  undefined1 (*local_1d38) [16];
  undefined1 (*local_1d30) [16];
  undefined8 uStack_1d28;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  element_type *local_1ca0;
  undefined1 (*local_1c98) [16];
  undefined1 (*local_1c90) [16];
  int local_1ac8;
  int iStack_1ac4;
  int iStack_1ac0;
  int iStack_1abc;
  int local_1ab8;
  int iStack_1ab4;
  int iStack_1ab0;
  int iStack_1aac;
  int local_1aa8;
  int iStack_1aa4;
  int iStack_1aa0;
  int iStack_1a9c;
  int local_1a98;
  int iStack_1a94;
  int iStack_1a90;
  int iStack_1a8c;
  int local_1a88;
  int iStack_1a84;
  int iStack_1a80;
  int iStack_1a7c;
  int local_1a78;
  int iStack_1a74;
  int iStack_1a70;
  int iStack_1a6c;
  int local_1a68;
  int iStack_1a64;
  int iStack_1a60;
  int iStack_1a5c;
  int local_1a58;
  int iStack_1a54;
  int iStack_1a50;
  int iStack_1a4c;
  int local_1a48;
  int iStack_1a44;
  int iStack_1a40;
  int iStack_1a3c;
  int local_1a38;
  int iStack_1a34;
  int iStack_1a30;
  int iStack_1a2c;
  int local_1a28;
  int iStack_1a24;
  int iStack_1a20;
  int iStack_1a1c;
  int local_1a18;
  int iStack_1a14;
  int iStack_1a10;
  int iStack_1a0c;
  int local_1a08;
  int iStack_1a04;
  int iStack_1a00;
  int iStack_19fc;
  int local_19f8;
  int iStack_19f4;
  int iStack_19f0;
  int iStack_19ec;
  int local_18e8;
  int i_5;
  __m128i b3_1;
  __m128i b2_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a3_1;
  __m128i a2_1;
  __m128i a1_1;
  __m128i a0_1;
  element_type *local_1840;
  undefined1 (*local_1838) [16];
  undefined1 (*local_1830) [16];
  int local_1588;
  int iStack_1584;
  int iStack_1580;
  int iStack_157c;
  int local_1578;
  int iStack_1574;
  int iStack_1570;
  int iStack_156c;
  int local_1568;
  int iStack_1564;
  int iStack_1560;
  int iStack_155c;
  int local_1558;
  int iStack_1554;
  int iStack_1550;
  int iStack_154c;
  int local_1548;
  int iStack_1544;
  int iStack_1540;
  int iStack_153c;
  int local_1538;
  int iStack_1534;
  int iStack_1530;
  int iStack_152c;
  int local_1528;
  int iStack_1524;
  int iStack_1520;
  int iStack_151c;
  int local_1518;
  int iStack_1514;
  int iStack_1510;
  int iStack_150c;
  int local_1508;
  int iStack_1504;
  int iStack_1500;
  int iStack_14fc;
  int local_14f8;
  int iStack_14f4;
  int iStack_14f0;
  int iStack_14ec;
  int local_14e8;
  int iStack_14e4;
  int iStack_14e0;
  int iStack_14dc;
  int local_14d8;
  int iStack_14d4;
  int iStack_14d0;
  int iStack_14cc;
  int local_14c8;
  int iStack_14c4;
  int iStack_14c0;
  int iStack_14bc;
  int local_14b8;
  int iStack_14b4;
  int iStack_14b0;
  int iStack_14ac;
  int local_1488;
  int i_7;
  __m128i b3_2;
  __m128i b2_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a3_2;
  __m128i a2_2;
  __m128i a1_2;
  __m128i a0_2;
  element_type *local_13e0;
  undefined1 (*local_13d8) [16];
  undefined1 (*local_13d0) [16];
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1308;
  undefined8 uStack_1300;
  int local_ffc;
  undefined8 uStack_ff8;
  int i_10;
  undefined8 uStack_ff0;
  uint local_fdc;
  element_type *local_fd8;
  uint local_fcc;
  undefined1 (*local_fc8) [16];
  uint local_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  uint local_fa4;
  uint local_fa0;
  uint local_f9c;
  uint local_f98;
  int local_f94;
  element_type *local_f90;
  undefined1 *local_f88;
  undefined1 (*local_f80) [16];
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  element_type *local_f60;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  element_type *local_f40;
  int local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  element_type *local_f20;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  element_type *local_f00;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  element_type *local_ee0;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  element_type *local_ec0;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  element_type *local_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  element_type *local_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  element_type *local_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  element_type *local_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  element_type *local_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  element_type *local_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  element_type *local_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  element_type *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined1 (*local_cd0) [16];
  undefined1 (*local_cc8) [16];
  undefined1 (*local_cc0) [16];
  undefined1 (*local_cb8) [16];
  undefined1 (*local_cb0) [16];
  undefined1 (*local_ca8) [16];
  undefined1 (*local_ca0) [16];
  undefined1 (*local_c98) [16];
  undefined1 (*local_c90) [16];
  undefined1 (*local_c88) [16];
  undefined1 (*local_c80) [16];
  undefined1 (*local_c78) [16];
  undefined1 (*local_c70) [16];
  undefined1 (*local_c68) [16];
  uint local_c5c;
  element_type *local_c58;
  uint local_c4c;
  undefined1 (*local_c48) [16];
  int local_c3c;
  undefined8 uStack_c38;
  int i_12;
  undefined8 uStack_c30;
  uint local_c1c;
  element_type *local_c18;
  uint local_c0c;
  undefined1 (*local_c08) [16];
  uint local_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  uint local_be4;
  uint local_be0;
  uint local_bdc;
  uint local_bd8;
  int local_bd4;
  element_type *local_bd0;
  undefined1 *local_bc8;
  undefined1 (*local_bc0) [16];
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  element_type *local_ba0;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  element_type *local_b80;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  element_type *local_b60;
  int local_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  element_type *local_b40;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  element_type *local_b20;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  element_type *local_b00;
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  element_type *local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  element_type *local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  element_type *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  element_type *local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  element_type *local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  element_type *local_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  element_type *local_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  element_type *local_a00;
  undefined1 (*local_9f8) [16];
  undefined1 (*local_9f0) [16];
  undefined1 (*local_9e8) [16];
  undefined1 (*local_9e0) [16];
  undefined1 (*local_9d8) [16];
  undefined1 (*local_9d0) [16];
  undefined1 (*local_9c8) [16];
  undefined1 (*local_9c0) [16];
  undefined1 (*local_9b8) [16];
  undefined1 (*local_9b0) [16];
  undefined1 (*local_9a8) [16];
  undefined1 (*local_9a0) [16];
  undefined1 (*local_998) [16];
  undefined1 (*local_990) [16];
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  uint local_89c;
  element_type *local_898;
  uint local_88c;
  undefined1 (*local_888) [16];
  int local_87c;
  undefined8 uStack_878;
  int i_14;
  undefined8 uStack_870;
  uint local_85c;
  element_type *local_858;
  uint local_84c;
  undefined1 (*local_848) [16];
  uint local_83c;
  undefined8 local_838;
  undefined8 uStack_830;
  uint local_824;
  uint local_820;
  uint local_81c;
  uint local_818;
  int local_814;
  element_type *local_810;
  undefined1 *local_808;
  undefined1 (*local_800) [16];
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  element_type *local_7e0;
  int local_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  element_type *local_7c0;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  element_type *local_7a0;
  int local_798;
  int iStack_794;
  int iStack_790;
  int iStack_78c;
  element_type *local_780;
  int local_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  element_type *local_760;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  element_type *local_740;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  element_type *local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  element_type *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  element_type *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  element_type *local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  element_type *local_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  element_type *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  element_type *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  element_type *local_640;
  undefined1 (*local_638) [16];
  undefined1 (*local_630) [16];
  undefined1 (*local_628) [16];
  undefined1 (*local_620) [16];
  undefined1 (*local_618) [16];
  undefined1 (*local_610) [16];
  undefined1 (*local_608) [16];
  undefined1 (*local_600) [16];
  undefined1 (*local_5f8) [16];
  undefined1 (*local_5f0) [16];
  undefined1 (*local_5e8) [16];
  undefined1 (*local_5e0) [16];
  undefined1 (*local_5d8) [16];
  undefined1 (*local_5d0) [16];
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  uint local_3fc;
  element_type *local_3f8;
  uint local_3ec;
  undefined1 (*local_3e8) [16];
  int local_3dc;
  undefined8 uStack_3d8;
  int i_16;
  undefined8 uStack_3d0;
  uint local_3bc;
  element_type *local_3b8;
  uint local_3ac;
  undefined1 (*local_3a8) [16];
  uint local_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  uint local_384;
  uint local_380;
  uint local_37c;
  uint local_378;
  int local_374;
  element_type *local_370;
  undefined1 *local_368;
  undefined1 (*local_360) [16];
  undefined1 local_358 [16];
  element_type *local_340;
  undefined1 local_338 [16];
  element_type *local_320;
  undefined1 local_318 [16];
  element_type *local_300;
  undefined1 local_2f8 [16];
  element_type *local_2e0;
  undefined1 local_2d8 [16];
  element_type *local_2c0;
  undefined1 local_2b8 [16];
  element_type *local_2a0;
  undefined1 local_298 [16];
  element_type *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  element_type *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  element_type *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  element_type *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  element_type *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  element_type *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  element_type *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  element_type *local_1a0;
  undefined1 (*local_198) [16];
  undefined1 (*local_190) [16];
  undefined1 (*local_188) [16];
  undefined1 (*local_180) [16];
  undefined1 (*local_178) [16];
  undefined1 (*local_170) [16];
  undefined1 (*local_168) [16];
  undefined1 (*local_160) [16];
  undefined1 (*local_158) [16];
  undefined1 (*local_150) [16];
  undefined1 (*local_148) [16];
  undefined1 (*local_140) [16];
  undefined1 (*local_138) [16];
  undefined1 (*local_130) [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_44;
  element_type *local_40;
  uint local_34;
  undefined1 (*local_30) [16];
  uint local_24;
  element_type *local_20;
  uint local_14;
  undefined1 (*local_10) [16];
  
  puVar20 = sse::common::malloc<unsigned_int>(length);
  std::shared_ptr<unsigned_int>::shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((shared_ptr<unsigned_int> *)
             &pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar20,
             sse::common::free<unsigned_int>);
  puVar20 = sse::common::malloc<unsigned_int>(length);
  std::shared_ptr<unsigned_int>::shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((shared_ptr<unsigned_int> *)local_22f0,puVar20,sse::common::free<unsigned_int>);
  puVar20 = sse::common::malloc<unsigned_int>(length + 1);
  std::shared_ptr<unsigned_int>::shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((shared_ptr<unsigned_int> *)&v1,puVar20,sse::common::free<unsigned_int>);
  pSrc1 = (undefined1 (*) [16])
          std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> *)
                     &pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pSrc2 = (undefined1 (*) [16])
          std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> *)local_22f0);
  pDst = std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> *)&v1);
  pDst[length] = 0x7f;
  uStack_1ff8 = CONCAT44(value1,value1);
  uStack_1ff0 = CONCAT44(value1,value1);
  local_1fc8 = (undefined1 *)&stack0xffffffffffffe008;
  iVar19 = (int)length >> 2;
  local_1fd0 = pSrc1;
  for (local_1fd4 = iVar19; 3 < local_1fd4; local_1fd4 = local_1fd4 + -4) {
    local_1ed0 = local_1fd0;
    local_1df0 = local_1fd0;
    *(undefined8 *)*local_1fd0 = uStack_1ff8;
    *(undefined8 *)(*local_1fd0 + 8) = uStack_1ff0;
    local_1ef0 = local_1fd0 + 1;
    *(undefined8 *)*local_1ef0 = uStack_1ff8;
    *(undefined8 *)(local_1fd0[1] + 8) = uStack_1ff0;
    local_1f10 = local_1fd0 + 2;
    *(undefined8 *)*local_1f10 = uStack_1ff8;
    *(undefined8 *)(local_1fd0[2] + 8) = uStack_1ff0;
    local_1f30 = local_1fd0 + 3;
    *(undefined8 *)*local_1f30 = uStack_1ff8;
    *(undefined8 *)(local_1fd0[3] + 8) = uStack_1ff0;
    local_1fd0 = local_1fd0 + 4;
    local_1fb8 = uStack_1ff8;
    uStack_1fb0 = uStack_1ff0;
    local_1fa8 = uStack_1ff8;
    uStack_1fa0 = uStack_1ff0;
    local_1f98 = uStack_1ff8;
    uStack_1f90 = uStack_1ff0;
    local_1f88 = uStack_1ff8;
    uStack_1f80 = uStack_1ff0;
    local_1f48 = uStack_1ff8;
    uStack_1f40 = uStack_1ff0;
    local_1f28 = uStack_1ff8;
    uStack_1f20 = uStack_1ff0;
    local_1f08 = uStack_1ff8;
    uStack_1f00 = uStack_1ff0;
    local_1ee8 = uStack_1ff8;
    uStack_1ee0 = uStack_1ff0;
    local_1e08 = uStack_1ff8;
    uStack_1e00 = uStack_1ff0;
    local_1de8 = uStack_1ff8;
    uStack_1de0 = uStack_1ff0;
    local_1dd0 = local_1ef0;
    local_1dc8 = uStack_1ff8;
    uStack_1dc0 = uStack_1ff0;
    local_1db0 = local_1f10;
    local_1da8 = uStack_1ff8;
    uStack_1da0 = uStack_1ff0;
    local_1d90 = local_1f30;
  }
  if (1 < local_1fd4) {
    local_1e90 = local_1fd0;
    local_1e30 = local_1fd0;
    *(undefined8 *)*local_1fd0 = uStack_1ff8;
    *(undefined8 *)(*local_1fd0 + 8) = uStack_1ff0;
    local_1eb0 = local_1fd0 + 1;
    *(undefined8 *)*local_1eb0 = uStack_1ff8;
    *(undefined8 *)(local_1fd0[1] + 8) = uStack_1ff0;
    local_1fd4 = local_1fd4 + -2;
    local_1fd0 = local_1fd0 + 2;
    local_1f78 = uStack_1ff8;
    uStack_1f70 = uStack_1ff0;
    local_1f68 = uStack_1ff8;
    uStack_1f60 = uStack_1ff0;
    local_1ec8 = uStack_1ff8;
    uStack_1ec0 = uStack_1ff0;
    local_1ea8 = uStack_1ff8;
    uStack_1ea0 = uStack_1ff0;
    local_1e48 = uStack_1ff8;
    uStack_1e40 = uStack_1ff0;
    local_1e28 = uStack_1ff8;
    uStack_1e20 = uStack_1ff0;
    local_1e10 = local_1eb0;
  }
  if (local_1fd4 != 0) {
    local_1e70 = local_1fd0;
    local_1e50 = local_1fd0;
    *(undefined8 *)*local_1fd0 = uStack_1ff8;
    *(undefined8 *)(*local_1fd0 + 8) = uStack_1ff0;
    local_1f58 = uStack_1ff8;
    uStack_1f50 = uStack_1ff0;
    local_1e88 = uStack_1ff8;
    uStack_1e80 = uStack_1ff0;
    local_1e68 = uStack_1ff8;
    uStack_1e60 = uStack_1ff0;
  }
  for (local_1ffc = length - (length & 3); local_1ffc < (int)length; local_1ffc = local_1ffc + 1) {
    *(uint *)(*pSrc1 + (long)local_1ffc * 4) = value1;
  }
  uStack_22a8 = CONCAT44(value2,value2);
  uStack_22a0 = CONCAT44(value2,value2);
  local_2278 = (undefined1 *)&stack0xffffffffffffdd58;
  local_2280 = pSrc2;
  for (local_2284 = iVar19; 3 < local_2284; local_2284 = local_2284 + -4) {
    local_2180 = local_2280;
    local_20a0 = local_2280;
    *(undefined8 *)*local_2280 = uStack_22a8;
    *(undefined8 *)(*local_2280 + 8) = uStack_22a0;
    local_21a0 = local_2280 + 1;
    *(undefined8 *)*local_21a0 = uStack_22a8;
    *(undefined8 *)(local_2280[1] + 8) = uStack_22a0;
    local_21c0 = local_2280 + 2;
    *(undefined8 *)*local_21c0 = uStack_22a8;
    *(undefined8 *)(local_2280[2] + 8) = uStack_22a0;
    local_21e0 = local_2280 + 3;
    *(undefined8 *)*local_21e0 = uStack_22a8;
    *(undefined8 *)(local_2280[3] + 8) = uStack_22a0;
    local_2280 = local_2280 + 4;
    local_2268 = uStack_22a8;
    uStack_2260 = uStack_22a0;
    local_2258 = uStack_22a8;
    uStack_2250 = uStack_22a0;
    local_2248 = uStack_22a8;
    uStack_2240 = uStack_22a0;
    local_2238 = uStack_22a8;
    uStack_2230 = uStack_22a0;
    local_21f8 = uStack_22a8;
    uStack_21f0 = uStack_22a0;
    local_21d8 = uStack_22a8;
    uStack_21d0 = uStack_22a0;
    local_21b8 = uStack_22a8;
    uStack_21b0 = uStack_22a0;
    local_2198 = uStack_22a8;
    uStack_2190 = uStack_22a0;
    local_20b8 = uStack_22a8;
    uStack_20b0 = uStack_22a0;
    local_2098 = uStack_22a8;
    uStack_2090 = uStack_22a0;
    local_2080 = local_21a0;
    local_2078 = uStack_22a8;
    uStack_2070 = uStack_22a0;
    local_2060 = local_21c0;
    local_2058 = uStack_22a8;
    uStack_2050 = uStack_22a0;
    local_2040 = local_21e0;
  }
  if (1 < local_2284) {
    local_2140 = local_2280;
    local_20e0 = local_2280;
    *(undefined8 *)*local_2280 = uStack_22a8;
    *(undefined8 *)(*local_2280 + 8) = uStack_22a0;
    local_2160 = local_2280 + 1;
    *(undefined8 *)*local_2160 = uStack_22a8;
    *(undefined8 *)(local_2280[1] + 8) = uStack_22a0;
    local_2284 = local_2284 + -2;
    local_2280 = local_2280 + 2;
    local_2228 = uStack_22a8;
    uStack_2220 = uStack_22a0;
    local_2218 = uStack_22a8;
    uStack_2210 = uStack_22a0;
    local_2178 = uStack_22a8;
    uStack_2170 = uStack_22a0;
    local_2158 = uStack_22a8;
    uStack_2150 = uStack_22a0;
    local_20f8 = uStack_22a8;
    uStack_20f0 = uStack_22a0;
    local_20d8 = uStack_22a8;
    uStack_20d0 = uStack_22a0;
    local_20c0 = local_2160;
  }
  if (local_2284 != 0) {
    local_2120 = local_2280;
    local_2100 = local_2280;
    *(undefined8 *)*local_2280 = uStack_22a8;
    *(undefined8 *)(*local_2280 + 8) = uStack_22a0;
    local_2208 = uStack_22a8;
    uStack_2200 = uStack_22a0;
    local_2138 = uStack_22a8;
    uStack_2130 = uStack_22a0;
    local_2118 = uStack_22a8;
    uStack_2110 = uStack_22a0;
  }
  for (local_22ac = length - (length & 3); local_22ac < (int)length; local_22ac = local_22ac + 1) {
    *(uint *)(*pSrc2 + (long)local_22ac * 4) = value2;
  }
  local_2294 = length;
  local_2290 = pSrc2;
  local_2288 = value2;
  local_226c = value2;
  local_2038 = uStack_22a8;
  uStack_2030 = uStack_22a0;
  local_201c = value2;
  local_2018 = value2;
  local_2014 = value2;
  local_2010 = value2;
  local_200c = length;
  local_2008 = pSrc1;
  local_2000 = value1;
  local_1fe4 = length;
  local_1fe0 = pSrc1;
  local_1fd8 = value1;
  local_1fbc = value1;
  local_1d88 = uStack_1ff8;
  uStack_1d80 = uStack_1ff0;
  local_1d74 = value1;
  local_1d70 = value1;
  local_1d6c = value1;
  local_1d68 = value1;
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>
                       (*(uint *)(*pSrc1 + (ulong)i_4 * 4),value1);
    if ((!bVar18) ||
       (bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>
                           (*(uint *)(*pSrc2 + (ulong)i_4 * 4),value2), !bVar18)) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x1a;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  local_1ca0 = pDst;
  local_1c98 = pSrc2;
  local_1c90 = pSrc1;
  for (a0[1]._4_4_ = iVar19; 3 < a0[1]._4_4_; a0[1]._4_4_ = a0[1]._4_4_ + -4) {
    uVar1 = *(undefined8 *)local_1c90[1];
    uVar2 = *(undefined8 *)(local_1c90[1] + 8);
    uVar3 = *(undefined8 *)local_1c90[2];
    uVar4 = *(undefined8 *)(local_1c90[2] + 8);
    uVar5 = *(undefined8 *)local_1c90[3];
    uVar6 = *(undefined8 *)(local_1c90[3] + 8);
    uVar7 = *(undefined8 *)local_1c98[1];
    uVar8 = *(undefined8 *)(local_1c98[1] + 8);
    b3[1] = *(longlong *)local_1c98[2];
    uVar9 = *(undefined8 *)(local_1c98[2] + 8);
    uStack_1d28 = *(undefined8 *)local_1c98[3];
    b3[0] = *(longlong *)(local_1c98[3] + 8);
    local_1a58 = (int)*(undefined8 *)*local_1c90;
    iStack_1a54 = (int)((ulong)*(undefined8 *)*local_1c90 >> 0x20);
    iStack_1a50 = (int)*(undefined8 *)(*local_1c90 + 8);
    iStack_1a4c = (int)((ulong)*(undefined8 *)(*local_1c90 + 8) >> 0x20);
    local_1a68 = (int)*(undefined8 *)*local_1c98;
    iStack_1a64 = (int)((ulong)*(undefined8 *)*local_1c98 >> 0x20);
    iStack_1a60 = (int)*(undefined8 *)(*local_1c98 + 8);
    iStack_1a5c = (int)((ulong)*(undefined8 *)(*local_1c98 + 8) >> 0x20);
    *(ulong *)local_1ca0 = CONCAT44(iStack_1a54 + iStack_1a64,local_1a58 + local_1a68);
    *(ulong *)(local_1ca0 + 2) = CONCAT44(iStack_1a4c + iStack_1a5c,iStack_1a50 + iStack_1a60);
    local_1a78 = (int)uVar1;
    iStack_1a74 = (int)((ulong)uVar1 >> 0x20);
    iStack_1a70 = (int)uVar2;
    iStack_1a6c = (int)((ulong)uVar2 >> 0x20);
    local_1a88 = (int)uVar7;
    iStack_1a84 = (int)((ulong)uVar7 >> 0x20);
    iStack_1a80 = (int)uVar8;
    iStack_1a7c = (int)((ulong)uVar8 >> 0x20);
    *(ulong *)(local_1ca0 + 4) = CONCAT44(iStack_1a74 + iStack_1a84,local_1a78 + local_1a88);
    *(ulong *)(local_1ca0 + 6) = CONCAT44(iStack_1a6c + iStack_1a7c,iStack_1a70 + iStack_1a80);
    local_1a98 = (int)uVar3;
    iStack_1a94 = (int)((ulong)uVar3 >> 0x20);
    iStack_1a90 = (int)uVar4;
    iStack_1a8c = (int)((ulong)uVar4 >> 0x20);
    local_1aa8 = (int)b3[1];
    iStack_1aa4 = (int)((ulong)b3[1] >> 0x20);
    iStack_1aa0 = (int)uVar9;
    iStack_1a9c = (int)((ulong)uVar9 >> 0x20);
    *(ulong *)(local_1ca0 + 8) = CONCAT44(iStack_1a94 + iStack_1aa4,local_1a98 + local_1aa8);
    *(ulong *)(local_1ca0 + 10) = CONCAT44(iStack_1a8c + iStack_1a9c,iStack_1a90 + iStack_1aa0);
    local_1ab8 = (int)uVar5;
    iStack_1ab4 = (int)((ulong)uVar5 >> 0x20);
    iStack_1ab0 = (int)uVar6;
    iStack_1aac = (int)((ulong)uVar6 >> 0x20);
    local_1ac8 = (int)uStack_1d28;
    iStack_1ac4 = (int)((ulong)uStack_1d28 >> 0x20);
    iStack_1ac0 = (int)b3[0];
    iStack_1abc = (int)((ulong)b3[0] >> 0x20);
    *(ulong *)(local_1ca0 + 0xc) = CONCAT44(iStack_1ab4 + iStack_1ac4,local_1ab8 + local_1ac8);
    *(ulong *)(local_1ca0 + 0xe) = CONCAT44(iStack_1aac + iStack_1abc,iStack_1ab0 + iStack_1ac0);
    local_1c90 = local_1c90 + 4;
    local_1c98 = local_1c98 + 4;
    local_1ca0 = local_1ca0 + 0x10;
  }
  if (1 < a0[1]._4_4_) {
    local_1a18 = (int)*(undefined8 *)*local_1c90;
    iStack_1a14 = (int)((ulong)*(undefined8 *)*local_1c90 >> 0x20);
    iStack_1a10 = (int)*(undefined8 *)(*local_1c90 + 8);
    iStack_1a0c = (int)((ulong)*(undefined8 *)(*local_1c90 + 8) >> 0x20);
    local_1a28 = (int)*(undefined8 *)*local_1c98;
    iStack_1a24 = (int)((ulong)*(undefined8 *)*local_1c98 >> 0x20);
    iStack_1a20 = (int)*(undefined8 *)(*local_1c98 + 8);
    iStack_1a1c = (int)((ulong)*(undefined8 *)(*local_1c98 + 8) >> 0x20);
    *(ulong *)local_1ca0 = CONCAT44(iStack_1a14 + iStack_1a24,local_1a18 + local_1a28);
    *(ulong *)(local_1ca0 + 2) = CONCAT44(iStack_1a0c + iStack_1a1c,iStack_1a10 + iStack_1a20);
    local_1a38 = (int)*(undefined8 *)local_1c90[1];
    iStack_1a34 = (int)((ulong)*(undefined8 *)local_1c90[1] >> 0x20);
    iStack_1a30 = (int)*(undefined8 *)(local_1c90[1] + 8);
    iStack_1a2c = (int)((ulong)*(undefined8 *)(local_1c90[1] + 8) >> 0x20);
    local_1a48 = (int)*(undefined8 *)local_1c98[1];
    iStack_1a44 = (int)((ulong)*(undefined8 *)local_1c98[1] >> 0x20);
    iStack_1a40 = (int)*(undefined8 *)(local_1c98[1] + 8);
    iStack_1a3c = (int)((ulong)*(undefined8 *)(local_1c98[1] + 8) >> 0x20);
    *(ulong *)(local_1ca0 + 4) = CONCAT44(iStack_1a34 + iStack_1a44,local_1a38 + local_1a48);
    *(ulong *)(local_1ca0 + 6) = CONCAT44(iStack_1a2c + iStack_1a3c,iStack_1a30 + iStack_1a40);
    a0[1]._4_4_ = a0[1]._4_4_ + -2;
    local_1c90 = local_1c90 + 2;
    local_1c98 = local_1c98 + 2;
    local_1ca0 = local_1ca0 + 8;
  }
  if (a0[1]._4_4_ != 0) {
    local_19f8 = (int)*(undefined8 *)*local_1c90;
    iStack_19f4 = (int)((ulong)*(undefined8 *)*local_1c90 >> 0x20);
    iStack_19f0 = (int)*(undefined8 *)(*local_1c90 + 8);
    iStack_19ec = (int)((ulong)*(undefined8 *)(*local_1c90 + 8) >> 0x20);
    local_1a08 = (int)*(undefined8 *)*local_1c98;
    iStack_1a04 = (int)((ulong)*(undefined8 *)*local_1c98 >> 0x20);
    iStack_1a00 = (int)*(undefined8 *)(*local_1c98 + 8);
    iStack_19fc = (int)((ulong)*(undefined8 *)(*local_1c98 + 8) >> 0x20);
    *(ulong *)local_1ca0 = CONCAT44(iStack_19f4 + iStack_1a04,local_19f8 + local_1a08);
    *(ulong *)(local_1ca0 + 2) = CONCAT44(iStack_19ec + iStack_19fc,iStack_19f0 + iStack_1a00);
  }
  for (local_1d48 = length - (length & 3); local_1d48 < (int)length; local_1d48 = local_1d48 + 1) {
    pDst[local_1d48] =
         *(int *)(*pSrc1 + (long)local_1d48 * 4) + *(int *)(*pSrc2 + (long)local_1d48 * 4);
  }
  local_1d64 = length;
  local_1d60 = pDst;
  local_1d58 = pSrc2;
  local_1d50 = pSrc1;
  local_1d44 = length;
  _i_3 = pDst;
  local_1d38 = pSrc2;
  local_1d30 = pSrc1;
  for (i_8 = 0; i_8 < length; i_8 = i_8 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[i_8],value1 + value2);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x22;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  local_1840 = pDst;
  local_1838 = pSrc2;
  local_1830 = pSrc1;
  for (a0_1[1]._4_4_ = iVar19; 3 < a0_1[1]._4_4_; a0_1[1]._4_4_ = a0_1[1]._4_4_ + -4) {
    uVar1 = *(undefined8 *)local_1830[1];
    uVar2 = *(undefined8 *)(local_1830[1] + 8);
    uVar3 = *(undefined8 *)local_1830[2];
    uVar4 = *(undefined8 *)(local_1830[2] + 8);
    uVar5 = *(undefined8 *)local_1830[3];
    uVar6 = *(undefined8 *)(local_1830[3] + 8);
    uVar7 = *(undefined8 *)local_1838[1];
    uVar8 = *(undefined8 *)(local_1838[1] + 8);
    uVar9 = *(undefined8 *)local_1838[2];
    uVar10 = *(undefined8 *)(local_1838[2] + 8);
    uVar11 = *(undefined8 *)local_1838[3];
    uVar12 = *(undefined8 *)(local_1838[3] + 8);
    local_1518 = (int)*(undefined8 *)*local_1830;
    iStack_1514 = (int)((ulong)*(undefined8 *)*local_1830 >> 0x20);
    iStack_1510 = (int)*(undefined8 *)(*local_1830 + 8);
    iStack_150c = (int)((ulong)*(undefined8 *)(*local_1830 + 8) >> 0x20);
    local_1528 = (int)*(undefined8 *)*local_1838;
    iStack_1524 = (int)((ulong)*(undefined8 *)*local_1838 >> 0x20);
    iStack_1520 = (int)*(undefined8 *)(*local_1838 + 8);
    iStack_151c = (int)((ulong)*(undefined8 *)(*local_1838 + 8) >> 0x20);
    *(ulong *)local_1840 = CONCAT44(iStack_1514 - iStack_1524,local_1518 - local_1528);
    *(ulong *)(local_1840 + 2) = CONCAT44(iStack_150c - iStack_151c,iStack_1510 - iStack_1520);
    local_1538 = (int)uVar1;
    iStack_1534 = (int)((ulong)uVar1 >> 0x20);
    iStack_1530 = (int)uVar2;
    iStack_152c = (int)((ulong)uVar2 >> 0x20);
    local_1548 = (int)uVar7;
    iStack_1544 = (int)((ulong)uVar7 >> 0x20);
    iStack_1540 = (int)uVar8;
    iStack_153c = (int)((ulong)uVar8 >> 0x20);
    *(ulong *)(local_1840 + 4) = CONCAT44(iStack_1534 - iStack_1544,local_1538 - local_1548);
    *(ulong *)(local_1840 + 6) = CONCAT44(iStack_152c - iStack_153c,iStack_1530 - iStack_1540);
    local_1558 = (int)uVar3;
    iStack_1554 = (int)((ulong)uVar3 >> 0x20);
    iStack_1550 = (int)uVar4;
    iStack_154c = (int)((ulong)uVar4 >> 0x20);
    local_1568 = (int)uVar9;
    iStack_1564 = (int)((ulong)uVar9 >> 0x20);
    iStack_1560 = (int)uVar10;
    iStack_155c = (int)((ulong)uVar10 >> 0x20);
    *(ulong *)(local_1840 + 8) = CONCAT44(iStack_1554 - iStack_1564,local_1558 - local_1568);
    *(ulong *)(local_1840 + 10) = CONCAT44(iStack_154c - iStack_155c,iStack_1550 - iStack_1560);
    local_1578 = (int)uVar5;
    iStack_1574 = (int)((ulong)uVar5 >> 0x20);
    iStack_1570 = (int)uVar6;
    iStack_156c = (int)((ulong)uVar6 >> 0x20);
    local_1588 = (int)uVar11;
    iStack_1584 = (int)((ulong)uVar11 >> 0x20);
    iStack_1580 = (int)uVar12;
    iStack_157c = (int)((ulong)uVar12 >> 0x20);
    *(ulong *)(local_1840 + 0xc) = CONCAT44(iStack_1574 - iStack_1584,local_1578 - local_1588);
    *(ulong *)(local_1840 + 0xe) = CONCAT44(iStack_156c - iStack_157c,iStack_1570 - iStack_1580);
    local_1830 = local_1830 + 4;
    local_1838 = local_1838 + 4;
    local_1840 = local_1840 + 0x10;
  }
  if (1 < a0_1[1]._4_4_) {
    local_14d8 = (int)*(undefined8 *)*local_1830;
    iStack_14d4 = (int)((ulong)*(undefined8 *)*local_1830 >> 0x20);
    iStack_14d0 = (int)*(undefined8 *)(*local_1830 + 8);
    iStack_14cc = (int)((ulong)*(undefined8 *)(*local_1830 + 8) >> 0x20);
    local_14e8 = (int)*(undefined8 *)*local_1838;
    iStack_14e4 = (int)((ulong)*(undefined8 *)*local_1838 >> 0x20);
    iStack_14e0 = (int)*(undefined8 *)(*local_1838 + 8);
    iStack_14dc = (int)((ulong)*(undefined8 *)(*local_1838 + 8) >> 0x20);
    *(ulong *)local_1840 = CONCAT44(iStack_14d4 - iStack_14e4,local_14d8 - local_14e8);
    *(ulong *)(local_1840 + 2) = CONCAT44(iStack_14cc - iStack_14dc,iStack_14d0 - iStack_14e0);
    local_14f8 = (int)*(undefined8 *)local_1830[1];
    iStack_14f4 = (int)((ulong)*(undefined8 *)local_1830[1] >> 0x20);
    iStack_14f0 = (int)*(undefined8 *)(local_1830[1] + 8);
    iStack_14ec = (int)((ulong)*(undefined8 *)(local_1830[1] + 8) >> 0x20);
    local_1508 = (int)*(undefined8 *)local_1838[1];
    iStack_1504 = (int)((ulong)*(undefined8 *)local_1838[1] >> 0x20);
    iStack_1500 = (int)*(undefined8 *)(local_1838[1] + 8);
    iStack_14fc = (int)((ulong)*(undefined8 *)(local_1838[1] + 8) >> 0x20);
    *(ulong *)(local_1840 + 4) = CONCAT44(iStack_14f4 - iStack_1504,local_14f8 - local_1508);
    *(ulong *)(local_1840 + 6) = CONCAT44(iStack_14ec - iStack_14fc,iStack_14f0 - iStack_1500);
    a0_1[1]._4_4_ = a0_1[1]._4_4_ + -2;
    local_1830 = local_1830 + 2;
    local_1838 = local_1838 + 2;
    local_1840 = local_1840 + 8;
  }
  if (a0_1[1]._4_4_ != 0) {
    local_14b8 = (int)*(undefined8 *)*local_1830;
    iStack_14b4 = (int)((ulong)*(undefined8 *)*local_1830 >> 0x20);
    iStack_14b0 = (int)*(undefined8 *)(*local_1830 + 8);
    iStack_14ac = (int)((ulong)*(undefined8 *)(*local_1830 + 8) >> 0x20);
    local_14c8 = (int)*(undefined8 *)*local_1838;
    iStack_14c4 = (int)((ulong)*(undefined8 *)*local_1838 >> 0x20);
    iStack_14c0 = (int)*(undefined8 *)(*local_1838 + 8);
    iStack_14bc = (int)((ulong)*(undefined8 *)(*local_1838 + 8) >> 0x20);
    *(ulong *)local_1840 = CONCAT44(iStack_14b4 - iStack_14c4,local_14b8 - local_14c8);
    *(ulong *)(local_1840 + 2) = CONCAT44(iStack_14ac - iStack_14bc,iStack_14b0 - iStack_14c0);
  }
  for (local_18e8 = length - (length & 3); local_18e8 < (int)length; local_18e8 = local_18e8 + 1) {
    pDst[local_18e8] =
         *(int *)(*pSrc1 + (long)local_18e8 * 4) - *(int *)(*pSrc2 + (long)local_18e8 * 4);
  }
  for (i_9 = 0; i_9 < length; i_9 = i_9 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[i_9],value1 - value2);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x2a;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  local_13e0 = pDst;
  local_13d8 = pSrc2;
  local_13d0 = pSrc1;
  for (a0_2[1]._4_4_ = iVar19; 3 < a0_2[1]._4_4_; a0_2[1]._4_4_ = a0_2[1]._4_4_ + -4) {
    auVar23 = local_13d0[1];
    auVar14 = local_13d0[2];
    auVar16 = local_13d0[3];
    auVar13 = local_13d8[1];
    auVar15 = local_13d8[2];
    auVar17 = local_13d8[3];
    auVar22 = pmulld(*local_13d0,*local_13d8);
    local_1308 = auVar22._0_8_;
    uStack_1300 = auVar22._8_8_;
    *(undefined8 *)local_13e0 = local_1308;
    *(undefined8 *)(local_13e0 + 2) = uStack_1300;
    auVar23 = pmulld(auVar23,auVar13);
    local_1328 = auVar23._0_8_;
    uStack_1320 = auVar23._8_8_;
    *(undefined8 *)(local_13e0 + 4) = local_1328;
    *(undefined8 *)(local_13e0 + 6) = uStack_1320;
    auVar23 = pmulld(auVar14,auVar15);
    local_1348 = auVar23._0_8_;
    uStack_1340 = auVar23._8_8_;
    *(undefined8 *)(local_13e0 + 8) = local_1348;
    *(undefined8 *)(local_13e0 + 10) = uStack_1340;
    auVar23 = pmulld(auVar16,auVar17);
    local_1368 = auVar23._0_8_;
    uStack_1360 = auVar23._8_8_;
    *(undefined8 *)(local_13e0 + 0xc) = local_1368;
    *(undefined8 *)(local_13e0 + 0xe) = uStack_1360;
    local_13d0 = local_13d0 + 4;
    local_13d8 = local_13d8 + 4;
    local_13e0 = local_13e0 + 0x10;
  }
  if (1 < a0_2[1]._4_4_) {
    auVar23 = pmulld(*local_13d0,*local_13d8);
    local_1388 = auVar23._0_8_;
    uStack_1380 = auVar23._8_8_;
    *(undefined8 *)local_13e0 = local_1388;
    *(undefined8 *)(local_13e0 + 2) = uStack_1380;
    auVar23 = pmulld(local_13d0[1],local_13d8[1]);
    local_13a8 = auVar23._0_8_;
    uStack_13a0 = auVar23._8_8_;
    *(undefined8 *)(local_13e0 + 4) = local_13a8;
    *(undefined8 *)(local_13e0 + 6) = uStack_13a0;
    a0_2[1]._4_4_ = a0_2[1]._4_4_ + -2;
    local_13d0 = local_13d0 + 2;
    local_13d8 = local_13d8 + 2;
    local_13e0 = local_13e0 + 8;
  }
  if (a0_2[1]._4_4_ != 0) {
    auVar23 = pmulld(*local_13d0,*local_13d8);
    local_13c8 = auVar23._0_8_;
    uStack_13c0 = auVar23._8_8_;
    *(undefined8 *)local_13e0 = local_13c8;
    *(undefined8 *)(local_13e0 + 2) = uStack_13c0;
  }
  for (local_1488 = length - (length & 3); local_1488 < (int)length; local_1488 = local_1488 + 1) {
    pDst[local_1488] =
         *(int *)(*pSrc1 + (long)local_1488 * 4) * *(int *)(*pSrc2 + (long)local_1488 * 4);
  }
  for (i_11 = 0; i_11 < length; i_11 = i_11 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[i_11],value1 * value2);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x32;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<unsigned_int>((uint *)pSrc1,(uint *)pSrc2,pDst,length);
  for (i_13 = 0; i_13 < length; i_13 = i_13 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[i_13],value1 / value2);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x3a;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  uStack_ff8 = CONCAT44(value2,value2);
  uStack_ff0 = CONCAT44(value2,value2);
  local_f88 = (undefined1 *)&stack0xfffffffffffff008;
  local_f90 = pDst;
  local_f80 = pSrc1;
  for (local_f94 = iVar19; 3 < local_f94; local_f94 = local_f94 + -4) {
    local_ea0 = local_f90;
    local_ca0 = local_f80;
    local_c98 = local_f80;
    uVar1 = *(undefined8 *)*local_f80;
    uVar2 = *(undefined8 *)(*local_f80 + 8);
    local_ce8._0_4_ = (int)uVar1;
    local_ce8._4_4_ = (int)((ulong)uVar1 >> 0x20);
    uStack_ce0._0_4_ = (int)uVar2;
    uStack_ce0._4_4_ = (int)((ulong)uVar2 >> 0x20);
    local_eb8 = (int)local_ce8 + value2;
    iStack_eb4 = local_ce8._4_4_ + value2;
    iStack_eb0 = (int)uStack_ce0 + value2;
    iStack_eac = uStack_ce0._4_4_ + value2;
    local_e80 = local_f90;
    local_e98 = CONCAT44(iStack_eb4,local_eb8);
    uStack_e90 = CONCAT44(iStack_eac,iStack_eb0);
    *(undefined8 *)local_f90 = local_e98;
    *(undefined8 *)(local_f90 + 2) = uStack_e90;
    local_ec0 = local_f90 + 4;
    local_ca8 = local_f80 + 1;
    uVar3 = *(undefined8 *)*local_ca8;
    uVar4 = *(undefined8 *)(local_f80[1] + 8);
    local_d08._0_4_ = (int)uVar3;
    local_d08._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uStack_d00._0_4_ = (int)uVar4;
    uStack_d00._4_4_ = (int)((ulong)uVar4 >> 0x20);
    local_ed8 = (int)local_d08 + value2;
    iStack_ed4 = local_d08._4_4_ + value2;
    iStack_ed0 = (int)uStack_d00 + value2;
    iStack_ecc = uStack_d00._4_4_ + value2;
    local_e78 = CONCAT44(iStack_ed4,local_ed8);
    uStack_e70 = CONCAT44(iStack_ecc,iStack_ed0);
    *(undefined8 *)local_ec0 = local_e78;
    *(undefined8 *)(local_f90 + 6) = uStack_e70;
    local_ee0 = local_f90 + 8;
    local_cb0 = local_f80 + 2;
    uVar5 = *(undefined8 *)*local_cb0;
    uVar6 = *(undefined8 *)(local_f80[2] + 8);
    local_d28._0_4_ = (int)uVar5;
    local_d28._4_4_ = (int)((ulong)uVar5 >> 0x20);
    uStack_d20._0_4_ = (int)uVar6;
    uStack_d20._4_4_ = (int)((ulong)uVar6 >> 0x20);
    local_ef8 = (int)local_d28 + value2;
    iStack_ef4 = local_d28._4_4_ + value2;
    iStack_ef0 = (int)uStack_d20 + value2;
    iStack_eec = uStack_d20._4_4_ + value2;
    local_e58 = CONCAT44(iStack_ef4,local_ef8);
    uStack_e50 = CONCAT44(iStack_eec,iStack_ef0);
    *(undefined8 *)local_ee0 = local_e58;
    *(undefined8 *)(local_f90 + 10) = uStack_e50;
    local_f00 = local_f90 + 0xc;
    local_cb8 = local_f80 + 3;
    uVar7 = *(undefined8 *)*local_cb8;
    uVar8 = *(undefined8 *)(local_f80[3] + 8);
    local_d48._0_4_ = (int)uVar7;
    local_d48._4_4_ = (int)((ulong)uVar7 >> 0x20);
    uStack_d40._0_4_ = (int)uVar8;
    uStack_d40._4_4_ = (int)((ulong)uVar8 >> 0x20);
    local_f18 = (int)local_d48 + value2;
    iStack_f14 = local_d48._4_4_ + value2;
    iStack_f10 = (int)uStack_d40 + value2;
    iStack_f0c = uStack_d40._4_4_ + value2;
    local_e38 = CONCAT44(iStack_f14,local_f18);
    uStack_e30 = CONCAT44(iStack_f0c,iStack_f10);
    *(undefined8 *)local_f00 = local_e38;
    *(undefined8 *)(local_f90 + 0xe) = uStack_e30;
    local_f80 = local_f80 + 4;
    local_f90 = local_f90 + 0x10;
    local_e60 = local_ec0;
    local_e40 = local_ee0;
    local_e20 = local_f00;
    local_d58 = uStack_ff8;
    uStack_d50 = uStack_ff0;
    local_d48 = uVar7;
    uStack_d40 = uVar8;
    local_d38 = uStack_ff8;
    uStack_d30 = uStack_ff0;
    local_d28 = uVar5;
    uStack_d20 = uVar6;
    local_d18 = uStack_ff8;
    uStack_d10 = uStack_ff0;
    local_d08 = uVar3;
    uStack_d00 = uVar4;
    local_cf8 = uStack_ff8;
    uStack_cf0 = uStack_ff0;
    local_ce8 = uVar1;
    uStack_ce0 = uVar2;
    local_c90 = local_ca8;
    local_c88 = local_cb0;
    local_c80 = local_cb8;
  }
  if (1 < local_f94) {
    local_cc0 = local_f80;
    local_c78 = local_f80;
    uVar1 = *(undefined8 *)*local_f80;
    uVar2 = *(undefined8 *)(*local_f80 + 8);
    local_d68._0_4_ = (int)uVar1;
    local_d68._4_4_ = (int)((ulong)uVar1 >> 0x20);
    uStack_d60._0_4_ = (int)uVar2;
    uStack_d60._4_4_ = (int)((ulong)uVar2 >> 0x20);
    local_f38 = (int)local_d68 + value2;
    iStack_f34 = local_d68._4_4_ + value2;
    iStack_f30 = (int)uStack_d60 + value2;
    iStack_f2c = uStack_d60._4_4_ + value2;
    local_f20 = local_f90;
    local_e18 = CONCAT44(iStack_f34,local_f38);
    uStack_e10 = CONCAT44(iStack_f2c,iStack_f30);
    local_e00 = local_f90;
    *(undefined8 *)local_f90 = local_e18;
    *(undefined8 *)(local_f90 + 2) = uStack_e10;
    local_f40 = local_f90 + 4;
    local_cc8 = local_f80 + 1;
    uVar3 = *(undefined8 *)*local_cc8;
    uVar4 = *(undefined8 *)(local_f80[1] + 8);
    local_d88._0_4_ = (int)uVar3;
    local_d88._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uStack_d80._0_4_ = (int)uVar4;
    uStack_d80._4_4_ = (int)((ulong)uVar4 >> 0x20);
    local_f58 = (int)local_d88 + value2;
    iStack_f54 = local_d88._4_4_ + value2;
    iStack_f50 = (int)uStack_d80 + value2;
    iStack_f4c = uStack_d80._4_4_ + value2;
    local_df8 = CONCAT44(iStack_f54,local_f58);
    uStack_df0 = CONCAT44(iStack_f4c,iStack_f50);
    *(undefined8 *)local_f40 = local_df8;
    *(undefined8 *)(local_f90 + 6) = uStack_df0;
    local_f94 = local_f94 + -2;
    local_f80 = local_f80 + 2;
    local_f90 = local_f90 + 8;
    local_de0 = local_f40;
    local_d98 = uStack_ff8;
    uStack_d90 = uStack_ff0;
    local_d88 = uVar3;
    uStack_d80 = uVar4;
    local_d78 = uStack_ff8;
    uStack_d70 = uStack_ff0;
    local_d68 = uVar1;
    uStack_d60 = uVar2;
    local_c70 = local_cc8;
  }
  if (local_f94 != 0) {
    local_cd0 = local_f80;
    local_c68 = local_f80;
    uVar1 = *(undefined8 *)*local_f80;
    uVar2 = *(undefined8 *)(*local_f80 + 8);
    local_da8._0_4_ = (int)uVar1;
    local_da8._4_4_ = (int)((ulong)uVar1 >> 0x20);
    uStack_da0._0_4_ = (int)uVar2;
    uStack_da0._4_4_ = (int)((ulong)uVar2 >> 0x20);
    local_f78 = (int)local_da8 + value2;
    iStack_f74 = local_da8._4_4_ + value2;
    iStack_f70 = (int)uStack_da0 + value2;
    iStack_f6c = uStack_da0._4_4_ + value2;
    local_f60 = local_f90;
    local_dd8 = CONCAT44(iStack_f74,local_f78);
    uStack_dd0 = CONCAT44(iStack_f6c,iStack_f70);
    local_dc0 = local_f90;
    *(undefined8 *)local_f90 = local_dd8;
    *(undefined8 *)(local_f90 + 2) = uStack_dd0;
    local_db8 = uStack_ff8;
    uStack_db0 = uStack_ff0;
    local_da8 = uVar1;
    uStack_da0 = uVar2;
  }
  for (local_ffc = length - (length & 3); local_ffc < (int)length; local_ffc = local_ffc + 1) {
    pDst[local_ffc] = *(int *)(*pSrc1 + (long)local_ffc * 4) + value2;
  }
  local_fdc = length;
  local_fd8 = pDst;
  local_fcc = value2;
  local_fc8 = pSrc1;
  local_fbc = value2;
  local_fb8 = uStack_ff8;
  uStack_fb0 = uStack_ff0;
  local_fa4 = value2;
  local_fa0 = value2;
  local_f9c = value2;
  local_f98 = value2;
  for (i_15 = 0; i_15 < length; i_15 = i_15 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[i_15],value1 + value2);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x43;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  uStack_c38 = CONCAT44(value2,value2);
  uStack_c30 = CONCAT44(value2,value2);
  local_bc8 = (undefined1 *)&stack0xfffffffffffff3c8;
  local_bd0 = pDst;
  local_bc0 = pSrc1;
  for (local_bd4 = iVar19; 3 < local_bd4; local_bd4 = local_bd4 + -4) {
    local_ae0 = local_bd0;
    local_9c8 = local_bc0;
    local_9c0 = local_bc0;
    uVar1 = *(undefined8 *)*local_bc0;
    uVar2 = *(undefined8 *)(*local_bc0 + 8);
    local_8b8._0_4_ = (int)uVar1;
    local_8b8._4_4_ = (int)((ulong)uVar1 >> 0x20);
    uStack_8b0._0_4_ = (int)uVar2;
    uStack_8b0._4_4_ = (int)((ulong)uVar2 >> 0x20);
    local_af8 = (int)local_8b8 - value2;
    iStack_af4 = local_8b8._4_4_ - value2;
    iStack_af0 = (int)uStack_8b0 - value2;
    iStack_aec = uStack_8b0._4_4_ - value2;
    local_ac0 = local_bd0;
    local_ad8 = CONCAT44(iStack_af4,local_af8);
    uStack_ad0 = CONCAT44(iStack_aec,iStack_af0);
    *(undefined8 *)local_bd0 = local_ad8;
    *(undefined8 *)(local_bd0 + 2) = uStack_ad0;
    local_b00 = local_bd0 + 4;
    local_9d0 = local_bc0 + 1;
    uVar3 = *(undefined8 *)*local_9d0;
    uVar4 = *(undefined8 *)(local_bc0[1] + 8);
    local_8d8._0_4_ = (int)uVar3;
    local_8d8._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uStack_8d0._0_4_ = (int)uVar4;
    uStack_8d0._4_4_ = (int)((ulong)uVar4 >> 0x20);
    local_b18 = (int)local_8d8 - value2;
    iStack_b14 = local_8d8._4_4_ - value2;
    iStack_b10 = (int)uStack_8d0 - value2;
    iStack_b0c = uStack_8d0._4_4_ - value2;
    local_ab8 = CONCAT44(iStack_b14,local_b18);
    uStack_ab0 = CONCAT44(iStack_b0c,iStack_b10);
    *(undefined8 *)local_b00 = local_ab8;
    *(undefined8 *)(local_bd0 + 6) = uStack_ab0;
    local_b20 = local_bd0 + 8;
    local_9d8 = local_bc0 + 2;
    uVar5 = *(undefined8 *)*local_9d8;
    uVar6 = *(undefined8 *)(local_bc0[2] + 8);
    local_8f8._0_4_ = (int)uVar5;
    local_8f8._4_4_ = (int)((ulong)uVar5 >> 0x20);
    uStack_8f0._0_4_ = (int)uVar6;
    uStack_8f0._4_4_ = (int)((ulong)uVar6 >> 0x20);
    local_b38 = (int)local_8f8 - value2;
    iStack_b34 = local_8f8._4_4_ - value2;
    iStack_b30 = (int)uStack_8f0 - value2;
    iStack_b2c = uStack_8f0._4_4_ - value2;
    local_a98 = CONCAT44(iStack_b34,local_b38);
    uStack_a90 = CONCAT44(iStack_b2c,iStack_b30);
    *(undefined8 *)local_b20 = local_a98;
    *(undefined8 *)(local_bd0 + 10) = uStack_a90;
    local_b40 = local_bd0 + 0xc;
    local_9e0 = local_bc0 + 3;
    uVar7 = *(undefined8 *)*local_9e0;
    uVar8 = *(undefined8 *)(local_bc0[3] + 8);
    local_918._0_4_ = (int)uVar7;
    local_918._4_4_ = (int)((ulong)uVar7 >> 0x20);
    uStack_910._0_4_ = (int)uVar8;
    uStack_910._4_4_ = (int)((ulong)uVar8 >> 0x20);
    local_b58 = (int)local_918 - value2;
    iStack_b54 = local_918._4_4_ - value2;
    iStack_b50 = (int)uStack_910 - value2;
    iStack_b4c = uStack_910._4_4_ - value2;
    local_a78 = CONCAT44(iStack_b54,local_b58);
    uStack_a70 = CONCAT44(iStack_b4c,iStack_b50);
    *(undefined8 *)local_b40 = local_a78;
    *(undefined8 *)(local_bd0 + 0xe) = uStack_a70;
    local_bc0 = local_bc0 + 4;
    local_bd0 = local_bd0 + 0x10;
    local_aa0 = local_b00;
    local_a80 = local_b20;
    local_a60 = local_b40;
    local_9b8 = local_9d0;
    local_9b0 = local_9d8;
    local_9a8 = local_9e0;
    local_928 = uStack_c38;
    uStack_920 = uStack_c30;
    local_918 = uVar7;
    uStack_910 = uVar8;
    local_908 = uStack_c38;
    uStack_900 = uStack_c30;
    local_8f8 = uVar5;
    uStack_8f0 = uVar6;
    local_8e8 = uStack_c38;
    uStack_8e0 = uStack_c30;
    local_8d8 = uVar3;
    uStack_8d0 = uVar4;
    local_8c8 = uStack_c38;
    uStack_8c0 = uStack_c30;
    local_8b8 = uVar1;
    uStack_8b0 = uVar2;
  }
  if (1 < local_bd4) {
    local_9e8 = local_bc0;
    local_9a0 = local_bc0;
    uVar1 = *(undefined8 *)*local_bc0;
    uVar2 = *(undefined8 *)(*local_bc0 + 8);
    local_938._0_4_ = (int)uVar1;
    local_938._4_4_ = (int)((ulong)uVar1 >> 0x20);
    uStack_930._0_4_ = (int)uVar2;
    uStack_930._4_4_ = (int)((ulong)uVar2 >> 0x20);
    local_b78 = (int)local_938 - value2;
    iStack_b74 = local_938._4_4_ - value2;
    iStack_b70 = (int)uStack_930 - value2;
    iStack_b6c = uStack_930._4_4_ - value2;
    local_b60 = local_bd0;
    local_a58 = CONCAT44(iStack_b74,local_b78);
    uStack_a50 = CONCAT44(iStack_b6c,iStack_b70);
    local_a40 = local_bd0;
    *(undefined8 *)local_bd0 = local_a58;
    *(undefined8 *)(local_bd0 + 2) = uStack_a50;
    local_b80 = local_bd0 + 4;
    local_9f0 = local_bc0 + 1;
    uVar3 = *(undefined8 *)*local_9f0;
    uVar4 = *(undefined8 *)(local_bc0[1] + 8);
    local_958._0_4_ = (int)uVar3;
    local_958._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uStack_950._0_4_ = (int)uVar4;
    uStack_950._4_4_ = (int)((ulong)uVar4 >> 0x20);
    local_b98 = (int)local_958 - value2;
    iStack_b94 = local_958._4_4_ - value2;
    iStack_b90 = (int)uStack_950 - value2;
    iStack_b8c = uStack_950._4_4_ - value2;
    local_a38 = CONCAT44(iStack_b94,local_b98);
    uStack_a30 = CONCAT44(iStack_b8c,iStack_b90);
    *(undefined8 *)local_b80 = local_a38;
    *(undefined8 *)(local_bd0 + 6) = uStack_a30;
    local_bd4 = local_bd4 + -2;
    local_bc0 = local_bc0 + 2;
    local_bd0 = local_bd0 + 8;
    local_a20 = local_b80;
    local_998 = local_9f0;
    local_968 = uStack_c38;
    uStack_960 = uStack_c30;
    local_958 = uVar3;
    uStack_950 = uVar4;
    local_948 = uStack_c38;
    uStack_940 = uStack_c30;
    local_938 = uVar1;
    uStack_930 = uVar2;
  }
  if (local_bd4 != 0) {
    local_9f8 = local_bc0;
    local_990 = local_bc0;
    uVar1 = *(undefined8 *)*local_bc0;
    uVar2 = *(undefined8 *)(*local_bc0 + 8);
    local_978._0_4_ = (int)uVar1;
    local_978._4_4_ = (int)((ulong)uVar1 >> 0x20);
    uStack_970._0_4_ = (int)uVar2;
    uStack_970._4_4_ = (int)((ulong)uVar2 >> 0x20);
    local_bb8 = (int)local_978 - value2;
    iStack_bb4 = local_978._4_4_ - value2;
    iStack_bb0 = (int)uStack_970 - value2;
    iStack_bac = uStack_970._4_4_ - value2;
    local_ba0 = local_bd0;
    local_a18 = CONCAT44(iStack_bb4,local_bb8);
    uStack_a10 = CONCAT44(iStack_bac,iStack_bb0);
    local_a00 = local_bd0;
    *(undefined8 *)local_bd0 = local_a18;
    *(undefined8 *)(local_bd0 + 2) = uStack_a10;
    local_988 = uStack_c38;
    uStack_980 = uStack_c30;
    local_978 = uVar1;
    uStack_970 = uVar2;
  }
  for (local_c3c = length - (length & 3); local_c3c < (int)length; local_c3c = local_c3c + 1) {
    pDst[local_c3c] = *(int *)(*pSrc1 + (long)local_c3c * 4) - value2;
  }
  for (i_17 = 0; local_c5c = length, local_c58 = pDst, local_c4c = value2, local_c48 = pSrc1,
      local_c1c = length, local_c18 = pDst, local_c0c = value2, local_c08 = pSrc1,
      local_bfc = value2, local_bf8 = uStack_c38, uStack_bf0 = uStack_c30, local_be4 = value2,
      local_be0 = value2, local_bdc = value2, local_bd8 = value2, i_17 < length; i_17 = i_17 + 1) {
    if (pDst[i_17] != value1 - value2) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x4b;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  uStack_878 = CONCAT44(value2,value2);
  uStack_870 = CONCAT44(value2,value2);
  local_808 = (undefined1 *)&stack0xfffffffffffff788;
  local_810 = pDst;
  local_800 = pSrc1;
  for (local_814 = iVar19; 3 < local_814; local_814 = local_814 + -4) {
    local_720 = local_810;
    local_608 = local_800;
    local_600 = local_800;
    local_4f8 = *(undefined8 *)*local_800;
    uStack_4f0 = *(undefined8 *)(*local_800 + 8);
    local_4e8._0_4_ = (int)local_4f8;
    local_4e8._4_4_ = (int)((ulong)local_4f8 >> 0x20);
    uStack_4e0._0_4_ = (int)uStack_4f0;
    uStack_4e0._4_4_ = (int)((ulong)uStack_4f0 >> 0x20);
    local_738 = value2 - (int)local_4e8;
    iStack_734 = value2 - local_4e8._4_4_;
    iStack_730 = value2 - (int)uStack_4e0;
    iStack_72c = value2 - uStack_4e0._4_4_;
    local_700 = local_810;
    local_718 = CONCAT44(iStack_734,local_738);
    uStack_710 = CONCAT44(iStack_72c,iStack_730);
    *(undefined8 *)local_810 = local_718;
    *(undefined8 *)(local_810 + 2) = uStack_710;
    local_740 = local_810 + 4;
    local_610 = local_800 + 1;
    local_538 = *(undefined8 *)*local_610;
    uStack_530 = *(undefined8 *)(local_800[1] + 8);
    local_528._0_4_ = (int)local_538;
    local_528._4_4_ = (int)((ulong)local_538 >> 0x20);
    uStack_520._0_4_ = (int)uStack_530;
    uStack_520._4_4_ = (int)((ulong)uStack_530 >> 0x20);
    local_758 = value2 - (int)local_528;
    iStack_754 = value2 - local_528._4_4_;
    iStack_750 = value2 - (int)uStack_520;
    iStack_74c = value2 - uStack_520._4_4_;
    local_6f8 = CONCAT44(iStack_754,local_758);
    uStack_6f0 = CONCAT44(iStack_74c,iStack_750);
    *(undefined8 *)local_740 = local_6f8;
    *(undefined8 *)(local_810 + 6) = uStack_6f0;
    local_760 = local_810 + 8;
    local_618 = local_800 + 2;
    local_578 = *(undefined8 *)*local_618;
    uStack_570 = *(undefined8 *)(local_800[2] + 8);
    local_568._0_4_ = (int)local_578;
    local_568._4_4_ = (int)((ulong)local_578 >> 0x20);
    uStack_560._0_4_ = (int)uStack_570;
    uStack_560._4_4_ = (int)((ulong)uStack_570 >> 0x20);
    local_778 = value2 - (int)local_568;
    iStack_774 = value2 - local_568._4_4_;
    iStack_770 = value2 - (int)uStack_560;
    iStack_76c = value2 - uStack_560._4_4_;
    local_6d8 = CONCAT44(iStack_774,local_778);
    uStack_6d0 = CONCAT44(iStack_76c,iStack_770);
    *(undefined8 *)local_760 = local_6d8;
    *(undefined8 *)(local_810 + 10) = uStack_6d0;
    local_780 = local_810 + 0xc;
    local_620 = local_800 + 3;
    local_5b8 = *(undefined8 *)*local_620;
    uStack_5b0 = *(undefined8 *)(local_800[3] + 8);
    local_5a8._0_4_ = (int)local_5b8;
    local_5a8._4_4_ = (int)((ulong)local_5b8 >> 0x20);
    uStack_5a0._0_4_ = (int)uStack_5b0;
    uStack_5a0._4_4_ = (int)((ulong)uStack_5b0 >> 0x20);
    local_798 = value2 - (int)local_5a8;
    iStack_794 = value2 - local_5a8._4_4_;
    iStack_790 = value2 - (int)uStack_5a0;
    iStack_78c = value2 - uStack_5a0._4_4_;
    local_6b8 = CONCAT44(iStack_794,local_798);
    uStack_6b0 = CONCAT44(iStack_78c,iStack_790);
    *(undefined8 *)local_780 = local_6b8;
    *(undefined8 *)(local_810 + 0xe) = uStack_6b0;
    local_800 = local_800 + 4;
    local_810 = local_810 + 0x10;
    local_6e0 = local_740;
    local_6c0 = local_760;
    local_6a0 = local_780;
    local_5f8 = local_610;
    local_5f0 = local_618;
    local_5e8 = local_620;
    local_5c8 = uStack_878;
    uStack_5c0 = uStack_870;
    local_5a8 = local_5b8;
    uStack_5a0 = uStack_5b0;
    local_598 = uStack_878;
    uStack_590 = uStack_870;
    local_588 = uStack_878;
    uStack_580 = uStack_870;
    local_568 = local_578;
    uStack_560 = uStack_570;
    local_558 = uStack_878;
    uStack_550 = uStack_870;
    local_548 = uStack_878;
    uStack_540 = uStack_870;
    local_528 = local_538;
    uStack_520 = uStack_530;
    local_518 = uStack_878;
    uStack_510 = uStack_870;
    local_508 = uStack_878;
    uStack_500 = uStack_870;
    local_4e8 = local_4f8;
    uStack_4e0 = uStack_4f0;
    local_4d8 = uStack_878;
    uStack_4d0 = uStack_870;
  }
  if (1 < local_814) {
    local_628 = local_800;
    local_5e0 = local_800;
    local_478 = *(undefined8 *)*local_800;
    uStack_470 = *(undefined8 *)(*local_800 + 8);
    local_468._0_4_ = (int)local_478;
    local_468._4_4_ = (int)((ulong)local_478 >> 0x20);
    uStack_460._0_4_ = (int)uStack_470;
    uStack_460._4_4_ = (int)((ulong)uStack_470 >> 0x20);
    local_7b8 = value2 - (int)local_468;
    iStack_7b4 = value2 - local_468._4_4_;
    iStack_7b0 = value2 - (int)uStack_460;
    iStack_7ac = value2 - uStack_460._4_4_;
    local_7a0 = local_810;
    local_698 = CONCAT44(iStack_7b4,local_7b8);
    uStack_690 = CONCAT44(iStack_7ac,iStack_7b0);
    local_680 = local_810;
    *(undefined8 *)local_810 = local_698;
    *(undefined8 *)(local_810 + 2) = uStack_690;
    local_7c0 = local_810 + 4;
    local_630 = local_800 + 1;
    local_4b8 = *(undefined8 *)*local_630;
    uStack_4b0 = *(undefined8 *)(local_800[1] + 8);
    local_4a8._0_4_ = (int)local_4b8;
    local_4a8._4_4_ = (int)((ulong)local_4b8 >> 0x20);
    uStack_4a0._0_4_ = (int)uStack_4b0;
    uStack_4a0._4_4_ = (int)((ulong)uStack_4b0 >> 0x20);
    local_7d8 = value2 - (int)local_4a8;
    iStack_7d4 = value2 - local_4a8._4_4_;
    iStack_7d0 = value2 - (int)uStack_4a0;
    iStack_7cc = value2 - uStack_4a0._4_4_;
    local_678 = CONCAT44(iStack_7d4,local_7d8);
    uStack_670 = CONCAT44(iStack_7cc,iStack_7d0);
    *(undefined8 *)local_7c0 = local_678;
    *(undefined8 *)(local_810 + 6) = uStack_670;
    local_814 = local_814 + -2;
    local_800 = local_800 + 2;
    local_810 = local_810 + 8;
    local_660 = local_7c0;
    local_5d8 = local_630;
    local_4c8 = uStack_878;
    uStack_4c0 = uStack_870;
    local_4a8 = local_4b8;
    uStack_4a0 = uStack_4b0;
    local_498 = uStack_878;
    uStack_490 = uStack_870;
    local_488 = uStack_878;
    uStack_480 = uStack_870;
    local_468 = local_478;
    uStack_460 = uStack_470;
    local_458 = uStack_878;
    uStack_450 = uStack_870;
  }
  if (local_814 != 0) {
    local_638 = local_800;
    local_5d0 = local_800;
    local_438 = *(undefined8 *)*local_800;
    uStack_430 = *(undefined8 *)(*local_800 + 8);
    local_428._0_4_ = (int)local_438;
    local_428._4_4_ = (int)((ulong)local_438 >> 0x20);
    uStack_420._0_4_ = (int)uStack_430;
    uStack_420._4_4_ = (int)((ulong)uStack_430 >> 0x20);
    local_7f8 = value2 - (int)local_428;
    iStack_7f4 = value2 - local_428._4_4_;
    iStack_7f0 = value2 - (int)uStack_420;
    iStack_7ec = value2 - uStack_420._4_4_;
    local_7e0 = local_810;
    local_658 = CONCAT44(iStack_7f4,local_7f8);
    uStack_650 = CONCAT44(iStack_7ec,iStack_7f0);
    local_640 = local_810;
    *(undefined8 *)local_810 = local_658;
    *(undefined8 *)(local_810 + 2) = uStack_650;
    local_448 = uStack_878;
    uStack_440 = uStack_870;
    local_428 = local_438;
    uStack_420 = uStack_430;
    local_418 = uStack_878;
    uStack_410 = uStack_870;
  }
  for (local_87c = length - (length & 3); local_87c < (int)length; local_87c = local_87c + 1) {
    pDst[local_87c] = value2 - *(int *)(*pSrc1 + (long)local_87c * 4);
  }
  local_89c = length;
  local_898 = pDst;
  local_88c = value2;
  local_888 = pSrc1;
  local_85c = length;
  local_858 = pDst;
  local_84c = value2;
  local_848 = pSrc1;
  local_83c = value2;
  local_838 = uStack_878;
  uStack_830 = uStack_870;
  local_824 = value2;
  local_820 = value2;
  local_81c = value2;
  local_818 = value2;
  for (i_18 = 0; i_18 < length; i_18 = i_18 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[i_18],value2 - value1);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x53;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  uStack_3d8 = CONCAT44(value2,value2);
  uStack_3d0 = CONCAT44(value2,value2);
  local_368 = (undefined1 *)&stack0xfffffffffffffc28;
  local_370 = pDst;
  local_360 = pSrc1;
  for (local_374 = iVar19; 3 < local_374; local_374 = local_374 + -4) {
    local_280 = local_370;
    local_168 = local_360;
    local_160 = local_360;
    local_58 = *(undefined8 *)*local_360;
    uStack_50 = *(undefined8 *)(*local_360 + 8);
    auVar23._8_8_ = uStack_3d0;
    auVar23._0_8_ = uStack_3d8;
    local_298 = pmulld(*local_360,auVar23);
    local_260 = local_370;
    local_278 = local_298._0_8_;
    uStack_270 = local_298._8_8_;
    *(undefined8 *)local_370 = local_298._0_8_;
    *(undefined8 *)(local_370 + 2) = local_298._8_8_;
    local_2a0 = local_370 + 4;
    local_170 = local_360 + 1;
    local_78 = *(undefined8 *)*local_170;
    uStack_70 = *(undefined8 *)(local_360[1] + 8);
    auVar13._8_8_ = uStack_3d0;
    auVar13._0_8_ = uStack_3d8;
    local_2b8 = pmulld(*local_170,auVar13);
    local_258 = local_2b8._0_8_;
    uStack_250 = local_2b8._8_8_;
    *(undefined8 *)local_2a0 = local_2b8._0_8_;
    *(undefined8 *)(local_370 + 6) = local_2b8._8_8_;
    local_2c0 = local_370 + 8;
    local_178 = local_360 + 2;
    local_98 = *(undefined8 *)*local_178;
    uStack_90 = *(undefined8 *)(local_360[2] + 8);
    auVar14._8_8_ = uStack_3d0;
    auVar14._0_8_ = uStack_3d8;
    local_2d8 = pmulld(*local_178,auVar14);
    local_238 = local_2d8._0_8_;
    uStack_230 = local_2d8._8_8_;
    *(undefined8 *)local_2c0 = local_2d8._0_8_;
    *(undefined8 *)(local_370 + 10) = local_2d8._8_8_;
    local_2e0 = local_370 + 0xc;
    local_180 = local_360 + 3;
    local_b8 = *(undefined8 *)*local_180;
    uStack_b0 = *(undefined8 *)(local_360[3] + 8);
    auVar15._8_8_ = uStack_3d0;
    auVar15._0_8_ = uStack_3d8;
    local_2f8 = pmulld(*local_180,auVar15);
    local_218 = local_2f8._0_8_;
    uStack_210 = local_2f8._8_8_;
    *(undefined8 *)local_2e0 = local_2f8._0_8_;
    *(undefined8 *)(local_370 + 0xe) = local_2f8._8_8_;
    local_360 = local_360 + 4;
    local_370 = local_370 + 0x10;
    local_240 = local_2a0;
    local_220 = local_2c0;
    local_200 = local_2e0;
    local_158 = local_170;
    local_150 = local_178;
    local_148 = local_180;
    local_c8 = uStack_3d8;
    uStack_c0 = uStack_3d0;
    local_a8 = uStack_3d8;
    uStack_a0 = uStack_3d0;
    local_88 = uStack_3d8;
    uStack_80 = uStack_3d0;
    local_68 = uStack_3d8;
    uStack_60 = uStack_3d0;
  }
  if (1 < local_374) {
    local_188 = local_360;
    local_140 = local_360;
    local_d8 = *(undefined8 *)*local_360;
    uStack_d0 = *(undefined8 *)(*local_360 + 8);
    auVar16._8_8_ = uStack_3d0;
    auVar16._0_8_ = uStack_3d8;
    local_318 = pmulld(*local_360,auVar16);
    local_300 = local_370;
    local_1e0 = local_370;
    local_1f8 = local_318._0_8_;
    uStack_1f0 = local_318._8_8_;
    *(undefined8 *)local_370 = local_318._0_8_;
    *(undefined8 *)(local_370 + 2) = local_318._8_8_;
    local_320 = local_370 + 4;
    local_190 = local_360 + 1;
    local_f8 = *(undefined8 *)*local_190;
    uStack_f0 = *(undefined8 *)(local_360[1] + 8);
    auVar17._8_8_ = uStack_3d0;
    auVar17._0_8_ = uStack_3d8;
    local_338 = pmulld(*local_190,auVar17);
    local_1d8 = local_338._0_8_;
    uStack_1d0 = local_338._8_8_;
    *(undefined8 *)local_320 = local_338._0_8_;
    *(undefined8 *)(local_370 + 6) = local_338._8_8_;
    local_374 = local_374 + -2;
    local_360 = local_360 + 2;
    local_370 = local_370 + 8;
    local_1c0 = local_320;
    local_138 = local_190;
    local_108 = uStack_3d8;
    uStack_100 = uStack_3d0;
    local_e8 = uStack_3d8;
    uStack_e0 = uStack_3d0;
  }
  if (local_374 != 0) {
    local_198 = local_360;
    local_130 = local_360;
    local_118 = *(undefined8 *)*local_360;
    uStack_110 = *(undefined8 *)(*local_360 + 8);
    auVar22._8_8_ = uStack_3d0;
    auVar22._0_8_ = uStack_3d8;
    local_358 = pmulld(*local_360,auVar22);
    local_340 = local_370;
    local_1a0 = local_370;
    local_1b8 = local_358._0_8_;
    uStack_1b0 = local_358._8_8_;
    *(undefined8 *)local_370 = local_358._0_8_;
    *(undefined8 *)(local_370 + 2) = local_358._8_8_;
    local_128 = uStack_3d8;
    uStack_120 = uStack_3d0;
  }
  for (local_3dc = length - (length & 3); local_3dc < (int)length; local_3dc = local_3dc + 1) {
    pDst[local_3dc] = *(int *)(*pSrc1 + (long)local_3dc * 4) * value2;
  }
  for (i_19 = 0; local_3fc = length, local_3f8 = pDst, local_3ec = value2, local_3e8 = pSrc1,
      local_3bc = length, local_3b8 = pDst, local_3ac = value2, local_3a8 = pSrc1,
      local_39c = value2, local_398 = uStack_3d8, uStack_390 = uStack_3d0, local_384 = value2,
      local_380 = value2, local_37c = value2, local_378 = value2, i_19 < length; i_19 = i_19 + 1) {
    if (pDst[i_19] != value1 * value2) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x5b;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  local_44 = length;
  local_40 = pDst;
  local_34 = value2;
  local_30 = pSrc1;
  nosimd::arithmetic::divC<unsigned_int>((uint *)pSrc1,value2,pDst,length);
  for (local_2354 = 0; local_2354 < length; local_2354 = local_2354 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[local_2354],value1 / value2);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 99;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  local_24 = length;
  local_20 = pDst;
  local_14 = value2;
  local_10 = pSrc1;
  nosimd::arithmetic::divCRev<unsigned_int>((uint *)pSrc1,value2,pDst,length);
  for (local_2358 = 0; local_2358 < length; local_2358 = local_2358 + 1) {
    bVar18 = anon_unknown.dwarf_157a4::equal<unsigned_int>(pDst[local_2358],value2 / value1);
    if (!bVar18) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar21 + 1) = 0x6b;
      *(uint *)((long)puVar21 + 0xc) = length;
      __cxa_throw(puVar21,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) && (pDst[length] != 0x7f)) {
    puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar21 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
    *(undefined4 *)(puVar21 + 1) = 0x70;
    *(uint *)((long)puVar21 + 0xc) = length;
    __cxa_throw(puVar21,&Exception::typeinfo,0);
  }
  std::shared_ptr<unsigned_int>::~shared_ptr((shared_ptr<unsigned_int> *)&v1);
  std::shared_ptr<unsigned_int>::~shared_ptr((shared_ptr<unsigned_int> *)local_22f0);
  std::shared_ptr<unsigned_int>::~shared_ptr
            ((shared_ptr<unsigned_int> *)
             &pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}